

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_cast.h
# Opt level: O0

uint (anonymous_namespace)::bit_cast<unsigned_int_const,float>(float *from)

{
  type storage;
  float *from_local;
  
  return (uint)*from;
}

Assistant:

inline constexpr To bit_cast(const From& from) noexcept {
  BIT_CAST_STATIC_ASSERTS(To, From);
  typename std::aligned_storage<sizeof(To), alignof(To)>::type storage;
  std::memcpy(&storage, &from, sizeof(To));  // Above `constexpr` is optimistic, fails here.
  return reinterpret_cast<To&>(storage);
  // More common implementation:
  // std::remove_const_t<To> to{};
  // std::memcpy(&to, &from, sizeof(To));  // Above `constexpr` is optimistic, fails here.
  // return to;
}